

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::TimeStamp::CalculateTimeStamp(TimeStamp *this)

{
  int iVar1;
  int iVar2;
  tm *ptVar3;
  time_t aclock;
  timespec ts;
  time_t local_28;
  timespec local_20;
  
  time(&local_28);
  ptVar3 = localtime(&local_28);
  iVar1 = ptVar3->tm_min;
  iVar2 = ptVar3->tm_sec;
  clock_gettime(0,&local_20);
  (this->m_TimeStampUnion).m_ui32TimeStamp =
       ((this->m_TimeStampUnion).m_ui32TimeStamp & 1) +
       (int)((double)(int)((double)(iVar1 * 0x3c + iVar2) / 1.67638e-06) +
            (double)local_20.tv_nsec / 1676.38) * 2;
  return;
}

Assistant:

void TimeStamp::CalculateTimeStamp()
{
    // Calculate the time by taking the minutes, seconds and milliseconds(if supported by os) since the hour and dividing them by 0.000001676
    KINT32 iTs = 0;

#if defined( WIN32 ) | defined( WIN64 ) // Microsoft Windows

    SYSTEMTIME now;
    GetSystemTime( &now );
    KFLOAT64 f = ( now.wMinute * 60 ) + now.wSecond + ( now.wMilliseconds / 1000.0 );
    iTs = f / 0.00000167638;

#else

    time_t aclock;
    time( &aclock );
    struct tm * newtime = localtime( &aclock );
    iTs = newtime->tm_sec + ( newtime->tm_min * 60 );
    iTs = iTs / 0.00000167638;

#endif

#if defined( linux ) // Linux -- Note: You need to include the rt library for clock_gettime.

    // Add nano seconds
    timespec ts;
    clock_gettime( 0, &ts );
    iTs += ts.tv_nsec / 1676.38;

#endif

    m_TimeStampUnion.m_ui32Time = iTs;
}